

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O3

bool __thiscall DatetimeParser::parse_minute(DatetimeParser *this,Pig *pig,int *value)

{
  bool bVar1;
  size_type previous;
  int minute;
  uint local_2c;
  
  previous = Pig::cursor(pig);
  bVar1 = Pig::getDigit2(pig,(int *)&local_2c);
  if (local_2c < 0x3c && bVar1) {
    *value = local_2c;
  }
  else {
    Pig::restoreTo(pig,previous);
  }
  return local_2c < 0x3c && bVar1;
}

Assistant:

bool DatetimeParser::parse_minute (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int minute;
  if (pig.getDigit2 (minute) &&
      minute >= 0            &&
      minute < 60)
  {
    value = minute;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}